

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.c
# Opt level: O1

char * yyqq(char *s)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  byte *__s;
  
  if (*s == '\0') {
    lVar8 = 0;
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    lVar6 = 0;
    do {
      bVar2 = s[lVar6 + 1];
      uVar7 = (ulong)bVar2;
      if (uVar7 < 0x26) {
        if ((0x2408003b80U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_00104fe3;
        if (uVar7 != 10) goto LAB_00104ffe;
        iVar3 = iVar3 + 4;
      }
      else {
LAB_00104ffe:
        if (bVar2 == 0x5c) {
LAB_00104fe3:
          iVar3 = iVar3 + 2;
        }
        else {
          iVar3 = iVar3 + (uint)((char)bVar2 < ' ') * 4 + 1;
        }
      }
      lVar8 = lVar6 + 1;
      lVar1 = lVar6 + 1;
      lVar6 = lVar8;
    } while (s[lVar1] != '\0');
  }
  if (iVar3 != (int)lVar8) {
    pbVar4 = (byte *)malloc((long)(iVar3 + 1));
    bVar2 = *s;
    __s = pbVar4;
    if (bVar2 != 0) {
      pbVar5 = (byte *)(s + 1);
      do {
        if (0x1a < bVar2) {
          if (bVar2 < 0x25) {
            if (bVar2 != 0x1b) {
              if (bVar2 == 0x22) {
LAB_00105083:
                *__s = 0x5c;
                goto LAB_001050b5;
              }
switchD_0010506a_default:
              if ((char)bVar2 < ' ') {
                sprintf((char *)__s,"\\%03o",(ulong)(uint)(int)(char)bVar2);
                goto LAB_001050d2;
              }
              *__s = bVar2;
              __s = __s + 1;
              goto LAB_001050f2;
            }
            __s[0] = 0x5c;
            __s[1] = 0x65;
          }
          else {
            if (bVar2 != 0x25) {
              if (bVar2 == 0x5c) goto LAB_00105083;
              goto switchD_0010506a_default;
            }
            *__s = 0x25;
LAB_001050b5:
            __s[1] = bVar2;
          }
          goto LAB_001050ee;
        }
        switch(bVar2) {
        case 7:
          __s[0] = 0x5c;
          __s[1] = 0x61;
          break;
        case 8:
          __s[0] = 0x5c;
          __s[1] = 0x62;
          break;
        case 9:
          __s[0] = 0x5c;
          __s[1] = 0x74;
          break;
        case 10:
          __s[0] = 0x5c;
          __s[1] = 0x6e;
          __s[2] = 0x5c;
          __s[3] = 10;
LAB_001050d2:
          __s = __s + 4;
          goto LAB_001050f2;
        case 0xb:
          __s[0] = 0x5c;
          __s[1] = 0x76;
          break;
        case 0xc:
          __s[0] = 0x5c;
          __s[1] = 0x66;
          break;
        case 0xd:
          __s[0] = 0x5c;
          __s[1] = 0x72;
          break;
        default:
          goto switchD_0010506a_default;
        }
LAB_001050ee:
        __s = __s + 2;
LAB_001050f2:
        bVar2 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      } while (bVar2 != 0);
    }
    *__s = 0;
    s = (char *)pbVar4;
  }
  return (char *)(byte *)s;
}

Assistant:

static char *yyqq(char* s) {
  char *d = s;
  char *dst;
  int sl = 0, dl = 0;
  while (*s++) {
    dl++; sl++;
    if (*s==7||*s==8||*s==9||*s==11||*s==12||*s==13||*s==27||*s==34||*s=='%'||*s==92) { dl++; } /* escape with '\' */
    else if (*s==10) { dl += 3; }        /* \n\^J */
    else if (*(signed char*)s<32) { dl += 4; } /* octal \000 */
  }
  if (dl == sl) return d;
  s = d;
  dst = d = (char *)malloc(dl+1);
  while (*s) {
    if (*s == '"') {
      *d++ = '\\'; *d++ = *s++;
    } else if (*s == '%') { /* '%' in printf */
      *d++ = '%'; *d++ = *s++;
    } else if (*s == '\n') { /* \n\^J */
      *d++ = '\\'; *d++ = 'n'; *d++ = '\\'; *d++ = 10; s++;
    } else if (*s == '\t') { /* ht */
      *d++ = '\\'; *d++ = 't'; s++;
    } else if (*s == '\r') { /*cr */
      *d++ = '\\'; *d++ = 'r'; s++;
    } else if (*s == '\a') { /*bel*/
      *d++ = '\\'; *d++ = 'a'; s++;
    } else if (*s == '\b') { /*bs*/
      *d++ = '\\'; *d++ = 'b'; s++;
    } else if (*s == '\e') { /*esc*/
      *d++ = '\\'; *d++ = 'e'; s++;
    } else if (*s == '\f') { /*ff*/
      *d++ = '\\'; *d++ = 'f'; s++;
    } else if (*s == '\v') { /*vt*/
      *d++ = '\\'; *d++ = 'v'; s++;
    } else if (*s == 92) { /* '\' */
      *d++ = '\\'; *d++ = *s++;
    } else if (*(signed char*)s<32) {
      sprintf(d,"\\%03o", *s); /* octal \000 */
      d += 4; s++;
    } else {
      *d++ = *s++;
    }
  }
  *d = 0;
  return dst;
}